

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

Error * ot::commissioner::BbrDatasetFromJson
                  (Error *__return_storage_ptr__,BbrDataset *aDataset,string *aJson)

{
  json_value *this;
  bool bVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view fmt;
  format_args args;
  JsonException *e;
  exception *e_1;
  anon_class_1_0_00000001 local_202;
  v10 local_201;
  v10 *local_200;
  size_t local_1f8;
  string local_1f0;
  Error local_1d0;
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  local_1a8;
  string local_178;
  input_adapter local_158;
  undefined1 local_148 [8];
  Json json;
  string *aJson_local;
  BbrDataset *aDataset_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  Error::Error(__return_storage_ptr__);
  json.m_value.object = (object_t *)0x0;
  this = &json.m_value;
  BbrDataset::BbrDataset((BbrDataset *)this);
  BbrDataset::operator=(aDataset,(BbrDataset *)this);
  BbrDataset::~BbrDataset((BbrDataset *)this);
  StripComments(&local_178,aJson);
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_158,&local_178);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::function(&local_1a8,(nullptr_t)0x0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)local_148,&local_158,&local_1a8,true);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::~function(&local_1a8);
  nlohmann::detail::input_adapter::~input_adapter(&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::is_null((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_148);
  if (bVar1) {
    BbrDatasetFromJson::anon_class_1_0_00000001::operator()(&local_202);
    local_58 = &local_200;
    local_60 = &local_201;
    bVar2 = ::fmt::v10::operator()(local_60);
    local_1f8 = bVar2.size_;
    local_200 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_1f0;
    local_78 = local_200;
    sStack_70 = local_1f8;
    local_50 = &local_78;
    local_88 = local_200;
    local_80 = local_1f8;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_20 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_1f0,local_88,fmt,args);
    Error::Error(&local_1d0,kNotFound,&local_1f0);
    Error::operator=(__return_storage_ptr__,&local_1d0);
    Error::~Error(&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  else {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator_BbrDataset<ot::commissioner::BbrDataset,_0>
              ((BbrDataset *)&e_1,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_148);
    BbrDataset::operator=(aDataset,(BbrDataset *)&e_1);
    BbrDataset::~BbrDataset((BbrDataset *)&e_1);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_148);
  return __return_storage_ptr__;
}

Assistant:

Error BbrDatasetFromJson(BbrDataset &aDataset, const std::string &aJson)
{
    Error error;

    aDataset = BbrDataset{};

    try
    {
        Json json = Json::parse(StripComments(aJson));
        if (json.is_null())
        {
            error = ERROR_NOT_FOUND("Empty BBR dataset from JSON");
        }
        else
        {
            aDataset = json;
        }
    } catch (JsonException &e)
    {
        error = e.GetError();
    } catch (std::exception &e)
    {
        error = {ErrorCode::kInvalidArgs, e.what()};
    }

    return error;
}